

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
ChainstateManager::ProcessNewBlockHeaders
          (ChainstateManager *this,span<const_CBlockHeader,_18446744073709551615UL> headers,
          bool min_pow_checked,BlockValidationState *state,CBlockIndex **ppindex)

{
  CBlockIndex *pCVar1;
  string_view source_file;
  bool bVar2;
  bool bVar3;
  time_point tVar4;
  long lVar5;
  Logger *pLVar6;
  long lVar7;
  CBlockHeader *block;
  BlockValidationState *args_1;
  iterator __begin1;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  double progress;
  CBlockIndex *pindex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  double local_e8 [14];
  undefined1 local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  block = headers._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&cs_main;
  local_58._M_string_length = local_58._M_string_length & 0xffffffffffffff00;
  args_1 = state;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_58);
  if (headers._M_extent._M_extent_value._M_extent_value != 0) {
    lVar7 = headers._M_extent._M_extent_value._M_extent_value * 0x50;
    do {
      local_78._0_8_ = (CBlockIndex *)0x0;
      args_1 = (BlockValidationState *)(ulong)min_pow_checked;
      bVar2 = AcceptBlockHeader(this,block,state,(CBlockIndex **)local_78,min_pow_checked);
      CheckBlockIndex(this);
      if (!bVar2) {
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&local_58);
        bVar2 = false;
        goto LAB_00afb4af;
      }
      if (ppindex != (CBlockIndex **)0x0) {
        *ppindex = (CBlockIndex *)local_78._0_8_;
      }
      block = block + 1;
      lVar7 = lVar7 + -0x50;
    } while (lVar7 != 0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_58);
  bVar3 = NotifyHeaderTip(this);
  bVar2 = true;
  if (bVar3) {
    bVar3 = IsInitialBlockDownload(this);
    if ((ppindex != (CBlockIndex **)0x0 && bVar3) &&
       (pCVar1 = *ppindex, pCVar1 != (CBlockIndex *)0x0)) {
      tVar4 = NodeClock::now();
      lVar5 = (long)((long)tVar4.__d.__r + (ulong)pCVar1->nTime * -1000000000) /
              ((((this->m_options).chainparams)->consensus).nPowTargetSpacing * 1000000000);
      lVar7 = 0;
      if (0 < lVar5) {
        lVar7 = lVar5;
      }
      local_e8[0] = ((double)pCVar1->nHeight * 100.0) / (double)(lVar7 + pCVar1->nHeight);
      pLVar6 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar6);
      if (bVar3) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<int,double>
                  ((string *)local_78,
                   (tinyformat *)"Synchronizing blockheaders, height: %d (~%.2f%%)\n",
                   (char *)&pCVar1->nHeight,(int *)local_e8,(double *)args_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        if ((CBlockIndex *)local_78._0_8_ != (CBlockIndex *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
        pLVar6 = LogInstance();
        local_78._0_8_ = (CBlockIndex *)0x57;
        local_78._8_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = local_58._M_dataplus._M_p;
        str._M_len = local_58._M_string_length;
        logging_function._M_str = "ProcessNewBlockHeaders";
        logging_function._M_len = 0x16;
        BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x113c,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
LAB_00afb4af:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::ProcessNewBlockHeaders(std::span<const CBlockHeader> headers, bool min_pow_checked, BlockValidationState& state, const CBlockIndex** ppindex)
{
    AssertLockNotHeld(cs_main);
    {
        LOCK(cs_main);
        for (const CBlockHeader& header : headers) {
            CBlockIndex *pindex = nullptr; // Use a temp pindex instead of ppindex to avoid a const_cast
            bool accepted{AcceptBlockHeader(header, state, &pindex, min_pow_checked)};
            CheckBlockIndex();

            if (!accepted) {
                return false;
            }
            if (ppindex) {
                *ppindex = pindex;
            }
        }
    }
    if (NotifyHeaderTip()) {
        if (IsInitialBlockDownload() && ppindex && *ppindex) {
            const CBlockIndex& last_accepted{**ppindex};
            int64_t blocks_left{(NodeClock::now() - last_accepted.Time()) / GetConsensus().PowTargetSpacing()};
            blocks_left = std::max<int64_t>(0, blocks_left);
            const double progress{100.0 * last_accepted.nHeight / (last_accepted.nHeight + blocks_left)};
            LogInfo("Synchronizing blockheaders, height: %d (~%.2f%%)\n", last_accepted.nHeight, progress);
        }
    }
    return true;
}